

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::_abi_1_10::a64::ARMRAPass::emitMove
          (ARMRAPass *this,uint32_t workId,uint32_t dstPhysId,uint32_t srcPhysId)

{
  VirtReg *pVVar1;
  Error EVar2;
  RAWorkReg *pRVar3;
  RAWorkReg *pRVar4;
  char *comment;
  BaseReg src;
  BaseReg dst;
  Operand_ local_50;
  Operand_ local_40;
  char *local_30;
  
  pRVar3 = BaseRAPass::workRegById(&this->super_BaseRAPass,workId);
  local_50._signature._bits = (pRVar3->_signature)._bits;
  local_40._data[0] = 0;
  local_40._data[1] = 0;
  local_50._data[0] = 0;
  local_50._data[1] = 0;
  local_50._baseId = srcPhysId;
  local_40._signature._bits = local_50._signature._bits;
  local_40._baseId = dstPhysId;
  if (((this->super_BaseRAPass)._diagnosticOptions & kRAAnnotate) == kNone) {
    comment = (char *)0x0;
  }
  else {
    pRVar4 = BaseRAPass::workRegById(&this->super_BaseRAPass,workId);
    pVVar1 = pRVar4->_virtReg;
    if (*(uint *)&(pVVar1->_name).field_0 < 0xc) {
      local_30 = (char *)((long)&(pVVar1->_name).field_0 + 4);
    }
    else {
      local_30 = *(char **)((long)&(pVVar1->_name).field_0 + 8);
    }
    String::assignFormat<char_const*>
              (&(this->super_BaseRAPass)._tmpString.super_String,"<MOVE> %s",&local_30);
    if ((this->super_BaseRAPass)._tmpString.super_String.field_0._type < 0x1f) {
      comment = (this->super_BaseRAPass)._tmpString.super_String.field_0._small.data;
    }
    else {
      comment = (this->super_BaseRAPass)._tmpString.super_String.field_0._large.data;
    }
  }
  EVar2 = EmitHelper::emitRegMove
                    (&this->_emitHelper,&local_40,&local_50,pRVar3->_virtReg->_typeId,comment);
  return EVar2;
}

Assistant:

Error ARMRAPass::emitMove(uint32_t workId, uint32_t dstPhysId, uint32_t srcPhysId) noexcept {
  RAWorkReg* wReg = workRegById(workId);
  BaseReg dst(wReg->signature(), dstPhysId);
  BaseReg src(wReg->signature(), srcPhysId);

  const char* comment = nullptr;

#ifndef ASMJIT_NO_LOGGING
  if (hasDiagnosticOption(DiagnosticOptions::kRAAnnotate)) {
    _tmpString.assignFormat("<MOVE> %s", workRegById(workId)->name());
    comment = _tmpString.data();
  }
#endif

  return _emitHelper.emitRegMove(dst, src, wReg->typeId(), comment);
}